

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp_arg_deduc.cpp
# Opt level: O1

void __thiscall sample<const_char_*>::sample(sample<const_char_*> *this,char *x,char *y,char *z)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tx:{",4);
  if (x == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105050);
  }
  else {
    sVar1 = strlen(x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,x,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y:{",3);
  if (y == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105050);
  }
  else {
    sVar1 = strlen(y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,y,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z:{",3);
  if (z == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105050);
  }
  else {
    sVar1 = strlen(z);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,z,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\t",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

sample (Tn x, Tn y, Tn z)	 {
			std::cout << "\tx:{" <<x << "}\t"
				<< "y:{" << y << "}\t" << "z:{"
				<< z << "}\t" << std::endl;
		}